

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Testing2_640x480at60_25.175MHz.c
# Opt level: O3

void vSyncLine(void)

{
  int iVar1;
  
  iVar1 = 0x28;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  putchar(5);
  iVar1 = 6;
  do {
    putchar(1);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  iVar1 = 3;
  do {
    putchar(5);
    iVar1 = iVar1 + -1;
  } while (iVar1 != 0);
  return;
}

Assistant:

void vSyncLine() {

    // Blanking
    for(int i=0;i<(640/16);i++) {
        putchar(0b00000101);
    }

    // Front Porch
    for(int i=0; i<(16/16); i++) {
        putchar(0b00000101);
    }

    // hSync
    for(int i=0;i<(96/16);i++) {
        putchar(0b00000001);
    }

    // Back Porch
    for(int i=0; i<(48/16); i++) {
        putchar(0b00000101);
    }

}